

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WAsmjsUtils.cpp
# Opt level: O2

uint32 WAsmJs::GetTypeByteSize(Types type)

{
  if (type < LIMIT) {
    return *(uint32 *)(&DAT_00f34570 + (ulong)type * 4);
  }
  Js::Throw::InternalError();
}

Assistant:

uint32 GetTypeByteSize(Types type)
    {
        // Since this needs to be done manually for each type, this assert will make sure to not forget to update this if a new type is added
        CompileAssert(WAsmJs::LIMIT == 5);
        switch (type)
        {
        case INT32  : return sizeof(int32);
        case INT64  : return sizeof(int64);
        case FLOAT32: return sizeof(float);
        case FLOAT64: return sizeof(double);
        case SIMD   : return sizeof(AsmJsSIMDValue);
        default     : break;
        }
        Js::Throw::InternalError();
    }